

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int subjournalPageIfRequired(PgHdr *pPg)

{
  Pager *pPager_00;
  PagerSavepoint *pPVar1;
  sqlite3_file *psVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 in_RAX;
  Pager *pPager;
  uint uVar7;
  sqlite3_vfs *psVar8;
  long lVar9;
  undefined8 uStack_38;
  
  pPager_00 = pPg->pPager;
  iVar5 = pPager_00->nSavepoint;
  if (0 < (long)iVar5) {
    uVar7 = pPg->pgno;
    pPVar1 = pPager_00->aSavepoint;
    lVar9 = 0;
    uStack_38 = in_RAX;
    do {
      if ((uVar7 <= *(uint *)((long)pPVar1->aWalData + lVar9 + -8)) &&
         (iVar4 = sqlite3BitvecTestNotNull
                            (*(Bitvec **)((long)pPVar1->aWalData + lVar9 + -0x10),uVar7),
         iVar6 = sqlite3Config.nStmtSpill, iVar4 == 0)) {
        if (pPager_00->journalMode == '\x02') goto LAB_001348f0;
        psVar2 = pPager_00->sjfd;
        if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
          if ((pPager_00->journalMode == '\x04') || (pPager_00->subjInMemory != '\0')) {
            psVar8 = pPager_00->pVfs;
            psVar2[6].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[7].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[4].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[5].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[2].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[3].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[8].pMethods = (sqlite3_io_methods *)0x0;
            iVar6 = -1;
            iVar5 = 0x3f8;
          }
          else {
            psVar8 = pPager_00->pVfs;
            psVar2[8].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[9].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[6].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[7].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[4].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[5].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[2].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[3].pMethods = (sqlite3_io_methods *)0x0;
            psVar2->pMethods = (sqlite3_io_methods *)0x0;
            psVar2[1].pMethods = (sqlite3_io_methods *)0x0;
            psVar2[10].pMethods = (sqlite3_io_methods *)0x0;
            if (iVar6 == 0) {
              iVar5 = (*psVar8->xOpen)((sqlite3_file *)psVar8,0);
              if (iVar5 != 0) {
                return iVar5;
              }
              goto LAB_0013495e;
            }
            iVar5 = 0x3f8;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
          }
          *(int *)&psVar2[1].pMethods = iVar5;
          psVar2->pMethods = &MemJournalMethods;
          *(int *)((long)&psVar2[1].pMethods + 4) = iVar6;
          *(undefined4 *)&psVar2[8].pMethods = 0x201e;
          psVar2[10].pMethods = (sqlite3_io_methods *)0x0;
          psVar2[9].pMethods = (sqlite3_io_methods *)psVar8;
        }
LAB_0013495e:
        pvVar3 = pPg->pData;
        lVar9 = ((long)pPager_00->pageSize + 4) * (ulong)pPager_00->nSubRec;
        uVar7 = pPg->pgno;
        uStack_38 = CONCAT44(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                             uVar7 << 0x18,(undefined4)uStack_38);
        iVar5 = (*pPager_00->sjfd->pMethods->xWrite)
                          (pPager_00->sjfd,(void *)((long)&uStack_38 + 4),4,lVar9);
        if (iVar5 != 0) {
          return iVar5;
        }
        iVar5 = (*pPager_00->sjfd->pMethods->xWrite)
                          (pPager_00->sjfd,pvVar3,pPager_00->pageSize,lVar9 + 4);
        if (iVar5 != 0) {
          return iVar5;
        }
        uVar7 = pPg->pgno;
LAB_001348f0:
        pPager_00->nSubRec = pPager_00->nSubRec + 1;
        iVar5 = addToSavepointBitvecs(pPager_00,uVar7);
        return iVar5;
      }
      lVar9 = lVar9 + 0x30;
    } while ((long)iVar5 * 0x30 != lVar9);
  }
  return 0;
}

Assistant:

static int subjournalPageIfRequired(PgHdr *pPg){
  if( subjRequiresPage(pPg) ){
    return subjournalPage(pPg);
  }else{
    return SQLITE_OK;
  }
}